

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O1

c_float compute_dua_tol(OSQPWorkspace *work,c_float eps_abs,c_float eps_rel)

{
  double dVar1;
  c_float cVar2;
  
  if ((work->settings->scaling == 0) || (work->settings->scaled_termination != 0)) {
    dVar1 = vec_norm_inf(work->data->q,work->data->n);
    cVar2 = vec_norm_inf(work->Aty,work->data->n);
    if (dVar1 <= cVar2) {
      dVar1 = cVar2;
    }
    cVar2 = vec_norm_inf(work->Px,work->data->n);
    if (dVar1 <= cVar2) {
      dVar1 = cVar2;
    }
  }
  else {
    dVar1 = vec_scaled_norm_inf(work->scaling->Dinv,work->data->q,work->data->n);
    cVar2 = vec_scaled_norm_inf(work->scaling->Dinv,work->Aty,work->data->n);
    if (dVar1 <= cVar2) {
      dVar1 = cVar2;
    }
    cVar2 = vec_scaled_norm_inf(work->scaling->Dinv,work->Px,work->data->n);
    if (dVar1 <= cVar2) {
      dVar1 = cVar2;
    }
    dVar1 = dVar1 * work->scaling->cinv;
  }
  return eps_rel * dVar1 + eps_abs;
}

Assistant:

c_float compute_dua_tol(OSQPWorkspace *work, c_float eps_abs, c_float eps_rel) {
  c_float max_rel_eps, temp_rel_eps;

  // max_rel_eps = max(||q||, ||A' y|, ||P x||)
  if (work->settings->scaling && !work->settings->scaled_termination) {
    // || Dinv q||
    max_rel_eps = vec_scaled_norm_inf(work->scaling->Dinv,
                                      work->data->q,
                                      work->data->n);

    // || Dinv A' y ||
    temp_rel_eps = vec_scaled_norm_inf(work->scaling->Dinv,
                                       work->Aty,
                                       work->data->n);
    max_rel_eps = c_max(max_rel_eps, temp_rel_eps);

    // || Dinv P x||
    temp_rel_eps = vec_scaled_norm_inf(work->scaling->Dinv,
                                       work->Px,
                                       work->data->n);
    max_rel_eps = c_max(max_rel_eps, temp_rel_eps);

    // Multiply by cinv
    max_rel_eps *= work->scaling->cinv;
  } else { // No scaling required
    // ||q||
    max_rel_eps = vec_norm_inf(work->data->q, work->data->n);

    // ||A'*y||
    temp_rel_eps = vec_norm_inf(work->Aty, work->data->n);
    max_rel_eps  = c_max(max_rel_eps, temp_rel_eps);

    // ||P*x||
    temp_rel_eps = vec_norm_inf(work->Px, work->data->n);
    max_rel_eps  = c_max(max_rel_eps, temp_rel_eps);
  }

  // eps_dual
  return eps_abs + eps_rel * max_rel_eps;
}